

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

void __thiscall
EVPTest_WycheproofRSAOAEP3072_Test::TestBody(EVPTest_WycheproofRSAOAEP3072_Test *this)

{
  EVPTest_WycheproofRSAOAEP3072_Test *this_local;
  
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_3072_sha256_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_3072_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_3072_sha512_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_3072_sha512_mgf1sha512_test.txt");
  return;
}

Assistant:

TEST(EVPTest, WycheproofRSAOAEP3072) {
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_3072_sha256_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_3072_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_3072_sha512_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_3072_sha512_mgf1sha512_test.txt");
}